

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_select::test_method(addrman_select *this)

{
  _Head_base<0UL,_AddrMan_*,_false> _Var1;
  bool bVar2;
  readonly_property65 rVar3;
  uint16_t uVar4;
  int32_t consistency_check_ratio;
  AddrMan *this_00;
  time_point tVar5;
  int iVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_00;
  const_string file_11;
  const_string file_12;
  initializer_list<CAddress> __l_01;
  const_string file_13;
  initializer_list<CAddress> __l_02;
  const_string file_14;
  initializer_list<CAddress> __l_03;
  const_string file_15;
  const_string file_16;
  initializer_list<CAddress> __l_04;
  const_string file_17;
  const_string file_18;
  initializer_list<CAddress> __l_05;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  __single_object addrman;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> ports;
  CService addr7;
  CService addr6;
  CService addr5;
  CService addr4;
  CService addr3;
  CService addr2;
  CService addr1;
  CNetAddr source;
  check_type cVar10;
  char *pcVar9;
  char local_854 [4];
  size_t local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  size_t *local_7c8;
  char *local_7c0;
  assertion_result local_7b8;
  size_t **local_7a0;
  vector<CAddress,_std::allocator<CAddress>_> local_798;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  _Head_base<0UL,_AddrMan_*,_false> local_400;
  undefined1 local_3f8 [8];
  assertion_result local_3f0;
  undefined1 local_3d8 [8];
  NodeSeconds local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3c8;
  _Base_ptr local_3b8;
  size_t local_3b0;
  direct_or_indirect local_3a8;
  uint local_398;
  Network local_390;
  uint32_t uStack_38c;
  uint16_t local_388;
  direct_or_indirect local_380;
  uint local_370;
  Network local_368;
  uint32_t uStack_364;
  uint16_t local_360;
  direct_or_indirect local_358;
  uint local_348;
  Network local_340;
  uint32_t uStack_33c;
  uint16_t local_338;
  direct_or_indirect local_330;
  uint local_320;
  Network local_318;
  uint32_t uStack_314;
  uint16_t local_310;
  direct_or_indirect local_308;
  uint local_2f8;
  undefined ***local_2f0;
  uint16_t local_2e8;
  direct_or_indirect local_2e0;
  uint local_2d0;
  undefined ***local_2c8;
  uint16_t local_2c0;
  direct_or_indirect local_2b8;
  uint local_2a8;
  Network local_2a0;
  uint32_t uStack_29c;
  uint16_t local_298;
  direct_or_indirect local_290;
  shared_count asStack_280 [2];
  uint16_t local_270;
  direct_or_indirect local_268;
  undefined1 *local_258;
  undefined ***local_250;
  uint16_t local_248;
  direct_or_indirect local_240;
  uint local_230;
  Network local_228;
  uint32_t uStack_224;
  uint16_t local_220;
  direct_or_indirect local_218;
  uint local_208;
  Network local_200;
  uint32_t uStack_1fc;
  uint16_t local_1f8;
  direct_or_indirect local_1f0;
  uint local_1e0;
  Network local_1d8;
  uint32_t uStack_1d4;
  uint16_t local_1d0;
  direct_or_indirect local_1c8;
  shared_count asStack_1b8 [2];
  uint16_t local_1a8;
  direct_or_indirect local_1a0;
  uint local_190;
  Network local_188;
  uint32_t uStack_184;
  uint16_t local_180;
  direct_or_indirect local_178;
  shared_count asStack_168 [2];
  uint16_t local_158;
  direct_or_indirect local_150;
  uint local_140;
  Network local_138;
  uint32_t uStack_134;
  uint16_t local_130;
  direct_or_indirect local_128;
  uint local_118;
  Network local_110;
  uint32_t uStack_10c;
  uint16_t local_108;
  readonly_property65 local_100;
  undefined7 uStack_ff;
  undefined8 local_f8;
  shared_count asStack_f0 [2];
  uint16_t local_e0;
  direct_or_indirect local_d8;
  uint local_c8;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b8;
  direct_or_indirect local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint16_t local_58;
  NodeSeconds local_50;
  ServiceFlags local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00 = (AddrMan *)operator_new(8);
  AddrMan::AddrMan(this_00,&EMPTY_NETGROUPMAN,true,consistency_check_ratio);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8c;
  file.m_begin = (iterator)&local_410;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_400._M_head_impl = this_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_420,msg);
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_100.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_f8 = (element_type *)0x0;
  asStack_f0[0].pi_ = (sp_counted_base *)0x0;
  local_178.indirect_contents.indirect = "!addrman->Select(false).first.IsValid()";
  local_178._8_8_ = (long)"!addrman->Select(false).first.IsValid()" + 0x27;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_428 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c8._8_8_ = &local_178;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_100,(lazy_ostream *)local_3d8,1,0,WARN,_cVar10,
             (size_t)&local_430,0x8c);
  boost::detail::shared_count::~shared_count(asStack_f0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8d;
  file_00.m_begin = (iterator)&local_440;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_450,
             msg_00);
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_100.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_f8 = (element_type *)0x0;
  asStack_f0[0].pi_ = (sp_counted_base *)0x0;
  local_178.indirect_contents.indirect = "!addrman->Select(true).first.IsValid()";
  local_178._8_8_ = (long)"!addrman->Select(true).first.IsValid()" + 0x26;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_458 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c8._8_8_ = &local_178;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_100,(lazy_ostream *)local_3d8,1,0,WARN,_cVar10,
             (size_t)&local_460,0x8d);
  boost::detail::shared_count::~shared_count(asStack_f0);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_d8.indirect_contents,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.1.1.1","");
  ResolveService((CService *)&local_100,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x93;
  file_01.m_begin = (iterator)&local_470;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_480,
             msg_01);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_100);
  _local_110 = asStack_f0[1].pi_;
  local_108 = local_e0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents);
  local_68._8_4_ = local_110;
  local_68._12_4_ = uStack_10c;
  local_58 = local_108;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_178,__l,
             (allocator_type *)&local_1f0);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_178,
                       (CNetAddr *)&local_d8.indirect_contents,(seconds)0x0);
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_b8._M_element_count = (size_type)&local_1c8;
  local_1c8.indirect_contents.indirect = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_1c8._8_8_ = (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_488 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,_cVar10,
             (size_t)&local_490,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_178);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_118) {
    free(local_128.indirect_contents.indirect);
    local_128.indirect_contents.indirect = (char *)0x0;
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x94;
  file_02.m_begin = (iterator)&local_4a0;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4b0,
             msg_02);
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290.indirect_contents.indirect =
       (char *)AddrMan::Size(local_400._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_1f0.indirect_contents.indirect = (char *)&local_290;
  local_268.indirect_contents.indirect = (char *)&local_2b8;
  local_2b8._0_4_ = 1;
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_1f0;
  local_b8._M_element_count = (size_type)&local_268;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abbb0;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  pcVar9 = "addrman->Size()";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_178.direct[0] = local_290.indirect_contents.indirect == (char *)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,2,REQUIRE,0xe52afd,
             (size_t)&local_1c8,0x94,(iterator)&local_78,"1U",&local_b8);
  boost::detail::shared_count::~shared_count(asStack_168);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x96;
  file_03.m_begin = (iterator)&local_4c0;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4d0,
             msg_03);
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  local_178.direct[0] = ::operator==((CService *)&local_78,(CService *)&local_100);
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect = "addrman->Select( true).first == addr1";
  local_1c8._8_8_ = (long)"addrman->Select( true).first == addr1" + 0x25;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c8._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_4e0,0x96);
  boost::detail::shared_count::~shared_count(asStack_168);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x97;
  file_04.m_begin = (iterator)&local_4f0;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_500,
             msg_04);
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  bVar2 = ::operator==((CService *)&local_78,(CService *)&local_100);
  local_178.direct[0] = bVar2;
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect = "addrman->Select( false).first == addr1";
  local_1c8._8_8_ = (long)"addrman->Select( false).first == addr1" + 0x26;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_508 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c8._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_510,0x97);
  boost::detail::shared_count::~shared_count(asStack_168);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x9a;
  file_05.m_begin = (iterator)&local_520;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_530,
             msg_05);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_100);
  _local_138 = asStack_f0[1].pi_;
  local_130 = local_e0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150.indirect_contents);
  local_68._8_4_ = local_138;
  local_68._12_4_ = uStack_134;
  local_58 = local_130;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_178.indirect_contents.indirect = "addrman->Good(CAddress(addr1, NODE_NONE))";
  local_178._8_8_ = (long)"!addrman->Good(CAddress(addr1, NODE_NONE))" + 0x2a;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_538 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b8._M_element_count = (size_type)&local_178;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_540,0x9a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_140) {
    free(local_150.indirect_contents.indirect);
    local_150.indirect_contents.indirect = (char *)0x0;
  }
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x9c;
  file_06.m_begin = (iterator)&local_550;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_560,
             msg_06);
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290.indirect_contents.indirect =
       (char *)AddrMan::Size(local_400._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_2b8._0_4_ = 1;
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_1f0.indirect_contents.indirect = (char *)&local_290;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_1f0;
  local_268.indirect_contents.indirect = (char *)&local_2b8;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abbb0;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b8._M_element_count = (size_type)&local_268;
  pcVar9 = "addrman->Size()";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_178.direct[0] = local_290.indirect_contents.indirect == (char *)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,2,REQUIRE,0xe52afd,
             (size_t)&local_1c8,0x9c,(CService *)&local_78,"1U",&local_b8);
  boost::detail::shared_count::~shared_count(asStack_168);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x9d;
  file_07.m_begin = (iterator)&local_570;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_580,
             msg_07);
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_178.direct[0] = !bVar2;
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect = "!addrman->Select( true).first.IsValid()";
  local_1c8._8_8_ = (long)"!addrman->Select( true).first.IsValid()" + 0x27;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_588 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c8._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_590,0x9d);
  boost::detail::shared_count::~shared_count(asStack_168);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x9e;
  file_08.m_begin = (iterator)&local_5a0;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5b0,
             msg_08);
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  bVar2 = ::operator==((CService *)&local_78,(CService *)&local_100);
  local_178.direct[0] = bVar2;
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect = "addrman->Select().first == addr1";
  local_1c8._8_8_ = (long)"addrman->Select().first == addr1" + 0x20;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  aStack_3c8._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_5c0,0x9e);
  boost::detail::shared_count::~shared_count(asStack_168);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x9f;
  file_09.m_begin = (iterator)&local_5d0;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5e0,
             msg_09);
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290.indirect_contents.indirect =
       (char *)AddrMan::Size(local_400._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_2b8._0_4_ = 1;
  local_178.direct[0] = local_290.indirect_contents.indirect == (char *)0x1;
  local_178._8_8_ = (element_type *)0x0;
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_1c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_1f0.indirect_contents.indirect = (char *)&local_290;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_1f0;
  local_268.indirect_contents.indirect = (char *)&local_2b8;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abbb0;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b8._M_element_count = (size_type)&local_268;
  pcVar9 = "addrman->Size()";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_3d8,1,2,REQUIRE,0xe52afd,
             (size_t)&local_1c8,0x9f,(CService *)&local_78,"1U",&local_b8);
  boost::detail::shared_count::~shared_count(asStack_168);
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.3.1.1","");
  ResolveService((CService *)&local_178,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa3;
  file_10.m_begin = (iterator)&local_5f0;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_600,
             msg_10);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178);
  _local_188 = asStack_168[1].pi_;
  local_180 = local_158;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents);
  local_68._8_4_ = local_188;
  local_68._12_4_ = uStack_184;
  local_58 = local_180;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8,__l_00,
             (allocator_type *)&local_268);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8,
                       (CNetAddr *)&local_178,(seconds)0x0);
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_1f0.indirect_contents.indirect = "addrman->Add({CAddress(addr2, NODE_NONE)}, addr2)";
  local_1f0._8_8_ = (long)"addrman->Add({CAddress(addr2, NODE_NONE)}, addr2)" + 0x31;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b8._M_element_count = (size_type)&local_1f0;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_608 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_610,0xa3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1c8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_190) {
    free(local_1a0.indirect_contents.indirect);
    local_1a0.indirect_contents.indirect = (char *)0x0;
  }
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa4;
  file_11.m_begin = (iterator)&local_620;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_630,
             msg_11);
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_400._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b8);
  bVar2 = ::operator==((CService *)&local_78,(CService *)&local_178);
  local_1c8.direct[0] = bVar2;
  local_1c8._8_8_ = (element_type *)0x0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  local_1f0.indirect_contents.indirect = "addrman->Select( true).first == addr2";
  local_1f0._8_8_ = (long)"addrman->Select( true).first == addr2" + 0x25;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c8._8_8_ = &local_1f0;
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_638 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1c8,(lazy_ostream *)local_3d8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_640,0xa4);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.3.2.2","");
  ResolveService((CService *)&local_1c8,(string *)&local_78,9999);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.3.3.3","");
  ResolveService((CService *)&local_1f0,(string *)&local_78,9999);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xaa;
  file_12.m_begin = (iterator)&local_650;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_660,
             msg_12);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_218.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8);
  _local_200 = asStack_1b8[1].pi_;
  local_1f8 = local_1a8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_218.indirect_contents);
  local_68._8_4_ = local_200;
  local_68._12_4_ = uStack_1fc;
  local_58 = local_1f8;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268,__l_01,
             (allocator_type *)&local_2b8.indirect_contents);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_268,
                       (CNetAddr *)&local_178,(seconds)0x0);
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_290.indirect_contents.indirect = "addrman->Add({CAddress(addr3, NODE_NONE)}, addr2)";
  local_290._8_8_ = (long)"addrman->Add({CAddress(addr3, NODE_NONE)}, addr2)" + 0x31;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b8._M_element_count = (size_type)&local_290;
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_668 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_670,0xaa);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_208) {
    free(local_218.indirect_contents.indirect);
    local_218.indirect_contents.indirect = (char *)0x0;
  }
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xab;
  file_13.m_begin = (iterator)&local_680;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_690,
             msg_13);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_240.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0);
  local_228 = local_1d8;
  uStack_224 = uStack_1d4;
  local_220 = local_1d0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_240.indirect_contents);
  local_68._8_4_ = local_228;
  local_68._12_4_ = uStack_224;
  local_58 = local_220;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2b8.indirect_contents,__l_02,
             (allocator_type *)&local_3f0);
  local_3d8 = (undefined1  [8])&aStack_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"250.4.1.1","");
  ResolveService((CService *)&local_b8,(string *)local_3d8,0x208d);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_2b8.indirect_contents,
                       (CNetAddr *)&local_b8,(seconds)0x0);
  local_290.direct[0] = bVar2;
  local_290._8_8_ = (element_type *)0x0;
  asStack_280[0].pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined ***)&local_7b8;
  local_7b8._0_8_ =
       "addrman->Add({CAddress(addr4, NODE_NONE)}, ResolveService(\"250.4.1.1\", 8333))";
  local_7b8.m_message.px = (element_type *)0xe52f2f;
  local_268.direct[8] = false;
  local_268.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abc70;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_698 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_290,(lazy_ostream *)&local_268,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_6a0,0xab);
  boost::detail::shared_count::~shared_count(asStack_280);
  if (0x10 < (uint)local_b8._M_before_begin._M_nxt) {
    free(local_b8._M_buckets);
    local_b8._M_buckets = (__buckets_ptr)0x0;
  }
  if (local_3d8 != (undefined1  [8])&aStack_3c8) {
    operator_delete((void *)local_3d8,(ulong)(aStack_3c8._M_allocated_capacity + 1));
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2b8.indirect_contents);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_230) {
    free(local_240.indirect_contents.indirect);
    local_240.indirect_contents.indirect = (char *)0x0;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.4.4.4","");
  ResolveService((CService *)&local_268,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.4.5.5","");
  ResolveService((CService *)&local_290,(string *)&local_78,0x1e61);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_78.indirect_contents.indirect = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.4.6.6","");
  ResolveService((CService *)&local_2b8.indirect_contents,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect != &local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)(local_68._M_allocated_capacity + 1))
    ;
  }
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xb2;
  file_14.m_begin = (iterator)&local_6b0;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6c0,
             msg_14);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2e0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_268);
  local_2c8 = local_250;
  local_2c0 = local_248;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2e0.indirect_contents);
  local_68._8_8_ = local_2c8;
  local_58 = local_2c0;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b8,__l_03,
             (allocator_type *)&local_798);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_7b8,
                       (CNetAddr *)&local_1c8,(seconds)0x0);
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_3f0._0_8_ = "addrman->Add({CAddress(addr5, NODE_NONE)}, addr3)";
  local_3f0.m_message.px = (element_type *)0xe52f7f;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6c8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b8._M_element_count = (size_type)&local_3f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_6d0,0xb2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_2d0) {
    free(local_2e0.indirect_contents.indirect);
    local_2e0.indirect_contents.indirect = (char *)0x0;
  }
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xb3;
  file_15.m_begin = (iterator)&local_6e0;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_6f0,
             msg_15);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_308.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_268);
  local_2f0 = local_250;
  local_2e8 = local_248;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_308.indirect_contents);
  local_68._8_8_ = local_2f0;
  local_58 = local_2e8;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_7b8._0_8_ = "addrman->Good(CAddress(addr5, NODE_NONE))";
  local_7b8.m_message.px = (element_type *)0xe52fa9;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6f8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b8._M_element_count = (size_type)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_700,0xb3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_2f8) {
    free(local_308.indirect_contents.indirect);
    local_308.indirect_contents.indirect = (char *)0x0;
  }
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xb4;
  file_16.m_begin = (iterator)&local_710;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_720,
             msg_16);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_330.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_290);
  _local_318 = asStack_280[1].pi_;
  local_310 = local_270;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_330.indirect_contents);
  local_68._8_4_ = local_318;
  local_68._12_4_ = uStack_314;
  local_58 = local_310;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b8,__l_04,
             (allocator_type *)&local_798);
  bVar2 = AddrMan::Add(_Var1._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_7b8,
                       (CNetAddr *)&local_1c8,(seconds)0x0);
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_3f0._0_8_ = "addrman->Add({CAddress(addr6, NODE_NONE)}, addr3)";
  local_3f0.m_message.px = (element_type *)0xe52fdb;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_728 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b8._M_element_count = (size_type)&local_3f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_730,0xb4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_7b8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_320) {
    free(local_330.indirect_contents.indirect);
    local_330.indirect_contents.indirect = (char *)0x0;
  }
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xb5;
  file_17.m_begin = (iterator)&local_740;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_750,
             msg_17);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_358.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_290);
  _local_340 = asStack_280[1].pi_;
  local_338 = local_270;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_358.indirect_contents);
  local_68._8_4_ = local_340;
  local_68._12_4_ = uStack_33c;
  local_58 = local_338;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_7b8._0_8_ = "addrman->Good(CAddress(addr6, NODE_NONE))";
  local_7b8.m_message.px = (element_type *)0xe53005;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_758 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b8._M_element_count = (size_type)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_760,0xb5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_348) {
    free(local_358.indirect_contents.indirect);
    local_358.indirect_contents.indirect = (char *)0x0;
  }
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xb6;
  file_18.m_begin = (iterator)&local_770;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_780,
             msg_18);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_380.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2b8.indirect_contents);
  local_368 = local_2a0;
  uStack_364 = uStack_29c;
  local_360 = local_298;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_380.indirect_contents);
  local_68._8_4_ = local_368;
  local_68._12_4_ = uStack_364;
  local_58 = local_360;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&local_798,__l_05,(allocator_type *)local_3f8);
  local_3d8 = (undefined1  [8])&aStack_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"250.1.1.3","");
  ResolveService((CService *)&local_b8,(string *)local_3d8,0x208d);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add(_Var1._M_head_impl,&local_798,(CNetAddr *)&local_b8,(seconds)0x0);
  local_3f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_3f0.m_message.px = (element_type *)0x0;
  local_3f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7a0 = &local_7c8;
  local_7c8 = (size_t *)0xe53006;
  local_7c0 = "";
  local_7b8.m_message.px = (element_type *)((ulong)local_7b8.m_message.px & 0xffffffffffffff00);
  local_7b8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_7b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7d0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f0,(lazy_ostream *)&local_7b8,1,0,WARN,(check_type)pcVar9,(size_t)&local_7d8,
             0xb6);
  boost::detail::shared_count::~shared_count(&local_3f0.m_message.pn);
  if (0x10 < (uint)local_b8._M_before_begin._M_nxt) {
    free(local_b8._M_buckets);
    local_b8._M_buckets = (__buckets_ptr)0x0;
  }
  if (local_3d8 != (undefined1  [8])&aStack_3c8) {
    operator_delete((void *)local_3d8,(ulong)(aStack_3c8._M_allocated_capacity + 1));
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_798);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_370) {
    free(local_380.indirect_contents.indirect);
    local_380.indirect_contents.indirect = (char *)0x0;
  }
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xb7;
  file_19.m_begin = (iterator)&local_7e8;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_7f8,
             msg_19);
  _Var1._M_head_impl = local_400._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_2b8.indirect_contents);
  local_390 = local_2a0;
  uStack_38c = uStack_29c;
  local_388 = local_298;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a8.indirect_contents);
  local_68._8_4_ = local_390;
  local_68._12_4_ = uStack_38c;
  local_58 = local_388;
  local_50.__d.__r = (duration)100000000;
  local_48 = NODE_NONE;
  tVar5 = NodeClock::now();
  bVar2 = AddrMan::Good(_Var1._M_head_impl,(CService *)&local_78,
                        (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  local_3d8[0] = bVar2;
  local_3d0.__d.__r = (duration)0;
  aStack_3c8._M_allocated_capacity = 0;
  local_7b8._0_8_ = "addrman->Good(CAddress(addr7, NODE_NONE))";
  local_7b8.m_message.px = (element_type *)0xe5307d;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abc70;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_800 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_b8._M_element_count = (size_type)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3d8,(lazy_ostream *)&local_b8,1,0,WARN,(check_type)pcVar9,
             (size_t)&local_808,0xb7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3c8);
  if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_398) {
    free(local_3a8.indirect_contents.indirect);
    local_3a8.indirect_contents.indirect = (char *)0x0;
  }
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xba;
  file_20.m_begin = (iterator)&local_818;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_828,
             msg_20);
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffffffffff00);
  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  aStack_3c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3c8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f8 = (undefined1  [8])
              AddrMan::Size(local_400._M_head_impl,(optional<Network>)0x0,(optional<bool>)0x0);
  local_7c8 = &local_850;
  local_850 = CONCAT44(local_850._4_4_,7);
  local_7b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_3f8 == (undefined1  [8])0x7);
  local_7b8.m_message.px = (element_type *)0x0;
  local_7b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f0.m_message.px = (element_type *)0xe52ae3;
  local_798.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_3f8;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abbb0;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b8._M_element_count = (size_type)&local_7c8;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_68._8_8_ = &local_798;
  boost::test_tools::tt_detail::report_assertion
            (&local_7b8,(lazy_ostream *)local_3d8,1,2,REQUIRE,0xe52afd,(size_t)&local_3f0,0xba,
             (CService *)&local_78,"7U",&local_b8);
  boost::detail::shared_count::~shared_count(&local_7b8.m_message.pn);
  aStack_3c8._8_8_ = &local_3d0;
  local_3d0.__d.__r = (duration)((ulong)local_3d0.__d.__r & 0xffffffff00000000);
  aStack_3c8._M_allocated_capacity = 0;
  local_3b0 = 0;
  iVar6 = 0x14;
  local_3b8 = (_Base_ptr)aStack_3c8._8_8_;
  do {
    local_b8._M_buckets = &local_b8._M_single_bucket;
    local_b8._M_bucket_count = 1;
    local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_b8._M_element_count = 0;
    local_b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_b8._M_rehash_policy._4_4_ = 0;
    local_b8._M_rehash_policy._M_next_resize = 0;
    local_b8._M_single_bucket = (__node_base_ptr)0x0;
    AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_78,local_400._M_head_impl,false,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&local_b8);
    uVar4 = CService::GetPort((CService *)&local_78);
    local_7b8._0_2_ = uVar4;
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::_M_insert_unique<unsigned_short>
              ((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                *)local_3d8,(unsigned_short *)&local_7b8);
    if (0x10 < (uint)local_68._M_allocated_capacity._0_4_) {
      free(local_78.indirect_contents.indirect);
      local_78.indirect_contents.indirect = (char *)0x0;
    }
    std::
    _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_830 = "";
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xc1;
  file_21.m_begin = (iterator)&local_838;
  msg_21.m_end = pvVar8;
  msg_21.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_848,
             msg_21);
  local_7b8.m_message.px = (element_type *)((ulong)local_7b8.m_message.px & 0xffffffffffffff00);
  local_7b8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_7b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7a0 = (size_t **)0xf6cf21;
  local_850 = local_3b0;
  local_3f8 = (undefined1  [8])local_854;
  local_3f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_3b0 == 3);
  local_854[0] = '\x03';
  local_854[1] = '\0';
  local_854[2] = '\0';
  local_854[3] = '\0';
  local_3f0.m_message.px = (element_type *)0x0;
  local_3f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_798.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe52a7d;
  local_798.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe52ae3;
  local_7c8 = &local_850;
  local_78.direct[8] = '\0';
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013abb70;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_68._8_8_ = &local_7c8;
  local_b8._M_bucket_count = local_b8._M_bucket_count & 0xffffffffffffff00;
  local_b8._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_013abbb0;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_b8._M_element_count = (size_type)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3f0,(lazy_ostream *)&local_7b8,1,2,REQUIRE,0xe5307e,(size_t)&local_798,0xc1,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_78,"3U",&local_b8);
  boost::detail::shared_count::~shared_count(&local_3f0.m_message.pn);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)local_3d8);
  if (0x10 < local_2a8) {
    free(local_2b8.indirect_contents.indirect);
    local_2b8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)asStack_280[0].pi_) {
    free(local_290.indirect_contents.indirect);
    local_290.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)local_258) {
    free(local_268.indirect_contents.indirect);
    local_268.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1e0) {
    free(local_1f0.indirect_contents.indirect);
    local_1f0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)asStack_1b8[0].pi_) {
    free(local_1c8.indirect_contents.indirect);
    local_1c8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)asStack_168[0].pi_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)asStack_f0[0].pi_) {
    free((void *)_local_100);
    _local_100 = (char *)0x0;
  }
  if (0x10 < local_c8) {
    free(local_d8.indirect_contents.indirect);
    local_d8.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_400);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(false).first.IsValid());
    BOOST_CHECK(!addrman->Select(true).first.IsValid());

    CNetAddr source = ResolveIP("252.2.2.2");

    // Add 1 address to the new table
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // Move address to the tried table
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));

    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
    BOOST_CHECK(!addrman->Select(/*new_only=*/true).first.IsValid());
    BOOST_CHECK(addrman->Select().first == addr1);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Add one address to the new table
    CService addr2 = ResolveService("250.3.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Select(/*new_only=*/true).first == addr2);

    // Add two more addresses to the new table
    CService addr3 = ResolveService("250.3.2.2", 9999);
    CService addr4 = ResolveService("250.3.3.3", 9999);

    BOOST_CHECK(addrman->Add({CAddress(addr3, NODE_NONE)}, addr2));
    BOOST_CHECK(addrman->Add({CAddress(addr4, NODE_NONE)}, ResolveService("250.4.1.1", 8333)));

    // Add three addresses to tried table.
    CService addr5 = ResolveService("250.4.4.4", 8333);
    CService addr6 = ResolveService("250.4.5.5", 7777);
    CService addr7 = ResolveService("250.4.6.6", 8333);

    BOOST_CHECK(addrman->Add({CAddress(addr5, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr5, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr6, NODE_NONE)}, addr3));
    BOOST_CHECK(addrman->Good(CAddress(addr6, NODE_NONE)));
    BOOST_CHECK(addrman->Add({CAddress(addr7, NODE_NONE)}, ResolveService("250.1.1.3", 8333)));
    BOOST_CHECK(addrman->Good(CAddress(addr7, NODE_NONE)));

    // 6 addrs + 1 addr from last test = 7.
    BOOST_CHECK_EQUAL(addrman->Size(), 7U);

    // Select pulls from new and tried regardless of port number.
    std::set<uint16_t> ports;
    for (int i = 0; i < 20; ++i) {
        ports.insert(addrman->Select().first.GetPort());
    }
    BOOST_CHECK_EQUAL(ports.size(), 3U);
}